

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O3

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeMemoryModelInstruction(UpgradeMemoryModel *this)

{
  IRContext *this_00;
  FeatureManager *pFVar1;
  tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_> tVar2;
  long lVar3;
  Instruction *node;
  pointer node_00;
  size_type sVar4;
  uint32_t uVar5;
  Capability cap;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  size_t byte_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t word;
  string extension;
  Instruction *local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  Op local_dc;
  undefined1 local_d8 [16];
  PodType local_c8 [2];
  undefined1 local_c0 [8];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b0;
  __uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> local_a8;
  UpgradeMemoryModel *local_a0;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_98;
  int local_90 [2];
  undefined1 local_88 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  initializer_list<spvtools::opt::Operand> local_60;
  long local_50;
  initializer_list<spvtools::opt::Operand> local_40;
  
  this_00 = (this->super_Pass).context_;
  local_98._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (((this_00->module_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
         _M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->memory_model_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t;
  local_100 = (Instruction *)CONCAT44(local_100._4_4_,0x11);
  local_a8._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
       ((ulong)local_a8._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl &
       0xffffffff00000000);
  local_dc = OpNop;
  local_88._24_8_ = local_88 + 0x10;
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88[0x10] = -0x1f;
  local_88[0x11] = '\x14';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88._8_8_ = 1;
  local_d8._0_4_ = 0x21;
  local_d8._8_8_ = &PTR__SmallVector_00b02ef8;
  local_c8[0].data._M_elems = (array<signed_char,_4UL>)0x0;
  local_c8[1].data._M_elems = (array<signed_char,_4UL>)0x0;
  local_b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0 = this;
  local_40._M_array = (iterator)this_00;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_88);
  local_60._M_array = (iterator)local_d8;
  local_60._M_len = 1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_f8,(IRContext **)&local_40,(Op *)&local_100,(int *)&local_a8,
             (int *)&local_dc,&local_60);
  uVar5 = (*(bool *)((long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + 0x2d) & 1) + 1;
  if (*(bool *)((long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x2c) == false) {
    uVar5 = (uint)*(bool *)((long)local_f8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 0x2d);
  }
  uVar5 = Instruction::GetSingleWordOperand
                    ((Instruction *)
                     local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar5);
  IRContext::AddCombinatorsForCapability(this_00,uVar5);
  pFVar1 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar1 != (FeatureManager *)0x0) {
    uVar5 = (*(bool *)((long)local_f8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + 0x2d) & 1) + 1;
    if (*(bool *)((long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x2c) == false) {
      uVar5 = (uint)*(bool *)((long)local_f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 0x2d);
    }
    cap = Instruction::GetSingleWordOperand
                    ((Instruction *)
                     local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar5);
    FeatureManager::AddCapability(pFVar1,cap);
  }
  if ((this_00->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (Instruction *)
               local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  node_00 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((this_00->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->capabilities_)
              .super_IntrusiveList<spvtools::opt::Instruction>,(Instruction *)node_00);
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + 8))();
  }
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._8_8_ = &PTR__SmallVector_00b02ef8;
  if (local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_68,local_68._M_head_impl);
  }
  local_60._M_array = (iterator)&local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"SPV_KHR_vulkan_memory_model","");
  sVar4 = local_60._M_len;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  uVar6 = 0;
  uVar7 = 0;
  do {
    uVar8 = 0;
    if (uVar7 < sVar4) {
      uVar8 = (uint)*(byte *)((long)(((OperandData *)(((local_60._M_array)->words).buffer + -4))->
                                     buffer + -6) + uVar7);
    }
    uVar9 = (uint)uVar7 & 3;
    uVar6 = uVar6 | uVar8 << (char)uVar9 * '\b';
    local_d8._0_4_ = uVar6;
    if (uVar9 == 3) {
      if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)local_d8);
      }
      else {
        *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar6;
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
      uVar6 = 0;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 <= sVar4);
  if (((int)sVar4 + 1U & 3) != 0) {
    if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_d8);
    }
    else {
      *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar6;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  tVar2.super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
       (local_a0->super_Pass).context_;
  local_dc = OpExtension;
  local_90[1] = 0;
  local_90[0] = 0;
  local_a8._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
       (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
       tVar2.
       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
       super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_88,&local_f8);
  local_d8._0_4_ = SPV_OPERAND_TYPE_LITERAL_STRING;
  local_d8._8_8_ = &PTR__SmallVector_00b02ef8;
  local_c8[0].data._M_elems = (array<signed_char,_4UL>)0x0;
  local_c8[1].data._M_elems = (array<signed_char,_4UL>)0x0;
  local_b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0;
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_d8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_88);
  local_40._M_len._0_4_ = (array<signed_char,_4UL>)0x1;
  local_40._M_len._4_4_ = (array<signed_char,_4UL>)0x0;
  local_40._M_array = (iterator)local_d8;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_100,(IRContext **)&local_a8,&local_dc,local_90 + 1,local_90,
             &local_40);
  if ((*(undefined1 *)
        ((long)tVar2.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl + 0xe0) &
      kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((((unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  *)((long)tVar2.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl +
                    0x58))->_M_t).
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               local_100);
  }
  pFVar1 = (((unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              *)((long)tVar2.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl + 0x68))
           ->_M_t).
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar1 != (FeatureManager *)0x0) {
    FeatureManager::AddExtension(pFVar1,local_100);
  }
  node = local_100;
  local_100 = (Instruction *)0x0;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((((unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> *)
                 ((long)tVar2.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl + 0x30))
                ->_M_t).
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->extensions_).
              super_IntrusiveList<spvtools::opt::Instruction>,node);
  if (local_100 != (Instruction *)0x0) {
    (*(local_100->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])()
    ;
  }
  local_100 = (Instruction *)0x0;
  local_d8._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
      local_b0._M_head_impl !=
      (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_88._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_68,local_68._M_head_impl);
  }
  local_c0 = (undefined1  [8])local_c8;
  local_d8._0_8_ = &PTR__SmallVector_00b02ef8;
  local_b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_c8[0].data._M_elems = (array<signed_char,_4UL>)0x3;
  local_d8._8_8_ = (_func_int **)0x1;
  uVar7 = (ulong)(*(bool *)((long)local_98._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                  _M_head_impl + 0x2d) & 1) + 1;
  if (*(bool *)((long)local_98._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
               0x2c) == false) {
    uVar7 = (ulong)*(bool *)((long)local_98._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                   _M_head_impl + 0x2d);
  }
  uVar7 = uVar7 + 1;
  lVar3 = *(long *)&(((OperandList *)
                     ((long)local_98._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                     + 0x38))->
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    )._M_impl;
  uVar10 = ((long)(((OperandList *)
                   ((long)local_98._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x38))->
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4) * -0x5555555555555555;
  if (uVar7 <= uVar10 && uVar10 - uVar7 != 0) {
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(lVar3 + (ulong)(uint)((int)uVar7 * 0x30) + 8),
               (SmallVector<unsigned_int,_2UL> *)local_d8);
    local_d8._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_b8,local_b8._M_head_impl);
    }
    if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60._M_array != (iterator)&local_50) {
      operator_delete(local_60._M_array,local_50 + 1);
    }
    return;
  }
  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b8,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

void UpgradeMemoryModel::UpgradeMemoryModelInstruction() {
  // Overall changes necessary:
  // 1. Add the OpExtension.
  // 2. Add the OpCapability.
  // 3. Modify the memory model.
  Instruction* memory_model = get_module()->GetMemoryModel();
  context()->AddCapability(MakeUnique<Instruction>(
      context(), spv::Op::OpCapability, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_CAPABILITY,
           {uint32_t(spv::Capability::VulkanMemoryModelKHR)}}}));
  const std::string extension = "SPV_KHR_vulkan_memory_model";
  std::vector<uint32_t> words = spvtools::utils::MakeVector(extension);
  context()->AddExtension(
      MakeUnique<Instruction>(context(), spv::Op::OpExtension, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_LITERAL_STRING, words}}));
  memory_model->SetInOperand(1u, {uint32_t(spv::MemoryModel::VulkanKHR)});
}